

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O3

bool __thiscall slang::ConstantRange::overlaps(ConstantRange *this,ConstantRange other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = other.left;
  iVar1 = this->left;
  iVar2 = this->right;
  iVar3 = iVar1;
  if (iVar2 < iVar1) {
    iVar3 = iVar2;
  }
  iVar4 = other.right;
  iVar6 = iVar4;
  if (iVar4 < iVar5) {
    iVar6 = iVar5;
  }
  if (iVar6 < iVar3) {
    return false;
  }
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  if (iVar5 <= iVar4) {
    iVar4 = iVar5;
  }
  return iVar4 <= iVar2;
}

Assistant:

bool ConstantRange::overlaps(ConstantRange other) const {
    return lower() <= other.upper() && upper() >= other.lower();
}